

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExtras.h
# Opt level: O3

bool llvm::is_contained<llvm::SmallPtrSet<llvm::cl::SubCommand*,4u>&,llvm::cl::SubCommand*>
               (SmallPtrSet<llvm::cl::SubCommand_*,_4U> *Range,SubCommand **Element)

{
  uint *puVar1;
  void **ppvVar2;
  uint *puVar3;
  uint *puVar4;
  void **ppvVar5;
  SmallPtrSetIteratorImpl local_48;
  void **local_38;
  
  local_48.Bucket =
       (Range->super_SmallPtrSetImpl<llvm::cl::SubCommand_*>).super_SmallPtrSetImplBase.CurArray;
  puVar1 = &(Range->super_SmallPtrSetImpl<llvm::cl::SubCommand_*>).super_SmallPtrSetImplBase.
            NumNonEmpty;
  puVar4 = &(Range->super_SmallPtrSetImpl<llvm::cl::SubCommand_*>).super_SmallPtrSetImplBase.
            CurArraySize;
  puVar3 = puVar4;
  if (local_48.Bucket ==
      (Range->super_SmallPtrSetImpl<llvm::cl::SubCommand_*>).super_SmallPtrSetImplBase.SmallArray) {
    puVar3 = puVar1;
  }
  local_48.End = local_48.Bucket + *puVar3;
  SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_48);
  ppvVar5 = local_48.Bucket;
  local_38 = local_48.End;
  local_48.Bucket =
       (Range->super_SmallPtrSetImpl<llvm::cl::SubCommand_*>).super_SmallPtrSetImplBase.CurArray;
  if (local_48.Bucket ==
      (Range->super_SmallPtrSetImpl<llvm::cl::SubCommand_*>).super_SmallPtrSetImplBase.SmallArray) {
    puVar4 = puVar1;
  }
  local_48.Bucket = local_48.Bucket + *puVar4;
  local_48.End = local_48.Bucket;
  SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_48);
  ppvVar2 = local_48.Bucket;
  local_48.End = local_38;
  local_48.Bucket = ppvVar5;
  while (local_48.Bucket != ppvVar2) {
    if (local_48.End <= local_48.Bucket) {
      __assert_fail("Bucket < End",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallPtrSet.h"
                    ,0x122,
                    "const PtrTy llvm::SmallPtrSetIterator<llvm::cl::SubCommand *>::operator*() const [PtrTy = llvm::cl::SubCommand *]"
                   );
    }
    ppvVar5 = local_48.Bucket;
    if ((SubCommand *)*local_48.Bucket == *Element) break;
    local_48.Bucket = local_48.Bucket + 1;
    SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_48);
    ppvVar5 = ppvVar2;
  }
  local_48.Bucket =
       (Range->super_SmallPtrSetImpl<llvm::cl::SubCommand_*>).super_SmallPtrSetImplBase.CurArray;
  local_48.Bucket =
       local_48.Bucket +
       *(uint *)((long)Range->SmallStorage +
                (ulong)(local_48.Bucket ==
                       (Range->super_SmallPtrSetImpl<llvm::cl::SubCommand_*>).
                       super_SmallPtrSetImplBase.SmallArray) * 4 + -0x10);
  local_48.End = local_48.Bucket;
  SmallPtrSetIteratorImpl::AdvanceIfNotValid(&local_48);
  return ppvVar5 != local_48.Bucket;
}

Assistant:

bool is_contained(R &&Range, const E &Element) {
  return std::find(adl_begin(Range), adl_end(Range), Element) != adl_end(Range);
}